

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O3

bool __thiscall QExceptionNotifier::event(QExceptionNotifier *this,QEvent *e)

{
  undefined1 uVar1;
  SocketState SVar2;
  
  if (*(short *)(e + 8) == 0x32) {
    SVar2 = QAbstractSocketEngine::state((QAbstractSocketEngine *)this->engine);
    if (SVar2 == ConnectingState) {
      QNativeSocketEngine::connectionNotification((QNativeSocketEngine *)this->engine);
    }
    else {
      QAbstractSocketEngine::exceptionNotification((QAbstractSocketEngine *)this->engine);
    }
    return true;
  }
  uVar1 = QSocketNotifier::event((QEvent *)this);
  return (bool)uVar1;
}

Assistant:

bool QExceptionNotifier::event(QEvent *e)
{
    if (e->type() == QEvent::SockAct) {
        if (engine->state() == QAbstractSocket::ConnectingState)
            engine->connectionNotification();
        else
            engine->exceptionNotification();
        return true;
    }
    return QSocketNotifier::event(e);
}